

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_stamp.c
# Opt level: O0

err_t cmdStampGen(char *stamp_name,char *name)

{
  bool_t bVar1;
  blob_t pvVar2;
  size_t in_RSI;
  void *in_RDI;
  octet *stamp;
  err_t code;
  bool_t in_stack_0000003c;
  char *in_stack_00000040;
  octet *in_stack_00000048;
  size_t in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  err_t eVar3;
  
  bVar1 = strIsValid((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if ((bVar1 == 0) ||
     (bVar1 = strIsValid((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)),
     bVar1 == 0)) {
    eVar3 = 0x6d;
  }
  else {
    pvVar2 = blobCreate(in_stack_ffffffffffffffd8);
    eVar3 = 0x6e;
    if (pvVar2 != (blob_t)0x0) {
      eVar3 = 0;
    }
    if (eVar3 == 0) {
      cmdFileStamp(in_stack_00000048,in_stack_00000040,in_stack_0000003c);
      bVar1 = cmdFileAreSame((char *)stamp,
                             (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (bVar1 == 0) {
        eVar3 = cmdFileWrite((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             in_RDI,in_RSI);
      }
      else {
        eVar3 = cmdFileAppend((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                              in_RDI,in_RSI);
      }
      blobClose((blob_t)0x10c51a);
    }
  }
  return eVar3;
}

Assistant:

err_t cmdStampGen(const char* stamp_name, const char* name)
{
	err_t code;
	octet* stamp;
	// входной контроль
	if (!strIsValid(name) || !strIsValid(stamp_name))
		return ERR_BAD_INPUT;
	// сгенерировать штамп
	code = cmdBlobCreate(stamp, 10);
	ERR_CALL_CHECK(code);
	cmdFileStamp(stamp, name, FALSE);
	// сохранить штамп
	if (cmdFileAreSame(name, stamp_name))
		code = cmdFileAppend(name, stamp, 10);
	else
		code = cmdFileWrite(stamp_name, stamp, 10);
	// завершить
	cmdBlobClose(stamp);
	return code;
}